

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O0

ON_PostEffect * __thiscall ON_PostEffects::PostEffectFromId(ON_PostEffects *this,ON_UUID *id)

{
  int i;
  ON_SimpleArray<ON_PostEffect_*> *this_00;
  ON_PostEffect **ppOVar1;
  int index;
  ON_UUID *id_local;
  ON_PostEffects *this_local;
  
  i = CImpl::IndexOfPostEffect(this->_impl,id);
  if (i < 0) {
    this_local = (ON_PostEffects *)0x0;
  }
  else {
    this_00 = CImpl::PostEffectList(this->_impl);
    ppOVar1 = ON_SimpleArray<ON_PostEffect_*>::operator[](this_00,i);
    this_local = (ON_PostEffects *)*ppOVar1;
  }
  return (ON_PostEffect *)this_local;
}

Assistant:

ON_PostEffect* ON_PostEffects::PostEffectFromId(const ON_UUID& id)
{
  const int index = _impl->IndexOfPostEffect(id);
  if (index < 0)
    return nullptr;

  return _impl->PostEffectList()[index];
}